

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trianglemesh.hpp
# Opt level: O0

vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> * __thiscall
TriangleMesh::loadfromfile(TriangleMesh *this,char *filename)

{
  vec2f vt1;
  vec3f v2;
  byte bVar1;
  bool bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  size_t sVar5;
  undefined8 *puVar6;
  istream *piVar7;
  char *pcVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference ppBVar12;
  char *in_RDX;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *in_RDI;
  vec3f vVar14;
  int ivn;
  int ivt;
  int iv;
  int i;
  int indices [3];
  bool recompute_normal;
  vector<vec2f,_std::allocator<vec2f>_> vvt;
  vector<vec3f,_std::allocator<vec3f>_> vvn;
  vector<vec3f,_std::allocator<vec3f>_> vv;
  vec3f t_2;
  vec2f t_1;
  vec3f t;
  string cmd;
  stringstream in;
  string line;
  vector<vec2f,_std::allocator<vec2f>_> vt;
  vector<vec3f,_std::allocator<vec3f>_> vn;
  vector<vec3f,_std::allocator<vec3f>_> v;
  ifstream fin;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *faces;
  value_type in_stack_fffffffffffff8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b0;
  float in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  ConsoleLogger *in_stack_fffffffffffff8c0;
  Triangle *local_718;
  byte local_646;
  vec3f local_544;
  vec3f local_538;
  undefined8 local_528;
  float local_520;
  undefined8 local_518;
  float fVar15;
  undefined4 in_stack_fffffffffffffaf4;
  vec2f vt2;
  float in_stack_fffffffffffffb04;
  undefined8 uVar16;
  float fVar17;
  vec3f local_4dc;
  value_type local_4d0;
  int in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  float in_stack_fffffffffffffb40;
  int local_4bc;
  float local_4b8;
  int local_4b4;
  int local_4b0;
  bool local_4a9;
  vec3f in_stack_fffffffffffffb58;
  vec2f in_stack_fffffffffffffb70;
  vec3f in_stack_fffffffffffffb78;
  vec3f in_stack_fffffffffffffb88;
  vec3f in_stack_fffffffffffffb98;
  vec2f local_454;
  vec3f local_44c;
  string local_440 [32];
  stringstream local_420 [392];
  string local_298 [32];
  vector<vec2f,_std::allocator<vec2f>_> local_278;
  vector<vec3f,_std::allocator<vec3f>_> local_260;
  vector<vec3f,_std::allocator<vec3f>_> local_248;
  byte local_22d;
  long local_220 [65];
  char *local_18;
  float fVar13;
  
  local_18 = in_RDX;
  github111116::ConsoleLogger::log<char[14],char_const*>
            (in_stack_fffffffffffff8c0,
             (char (*) [14])CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             (char **)in_stack_fffffffffffff8b0);
  pcVar8 = local_18;
  sVar5 = strlen(local_18);
  iVar3 = strcmp(pcVar8 + (sVar5 - 4),".obj");
  if (iVar3 != 0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "format must be obj";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  std::ifstream::ifstream(local_220,local_18,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "Can\'t open file";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  local_22d = 0;
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector
            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)0x187c64);
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)0x187c71);
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)0x187c7e);
  std::vector<vec2f,_std::allocator<vec2f>_>::vector
            ((vector<vec2f,_std::allocator<vec2f>_> *)0x187c8b);
  std::__cxx11::string::string(local_298);
  do {
    do {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_220,local_298);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (!bVar2) {
        local_22d = 1;
        std::__cxx11::string::~string(local_298);
        std::vector<vec2f,_std::allocator<vec2f>_>::~vector
                  ((vector<vec2f,_std::allocator<vec2f>_> *)in_stack_fffffffffffff8c0);
        std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                  ((vector<vec3f,_std::allocator<vec3f>_> *)in_stack_fffffffffffff8c0);
        std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                  ((vector<vec3f,_std::allocator<vec3f>_> *)in_stack_fffffffffffff8c0);
        if ((local_22d & 1) == 0) {
          std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector
                    ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
                     in_stack_fffffffffffff8c0);
        }
        std::ifstream::~ifstream(local_220);
        return in_RDI;
      }
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_298);
      iVar3 = isalpha((int)*pcVar8);
    } while (iVar3 == 0);
    _Var4 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_420,local_298,_Var4);
    std::__cxx11::string::string(local_440);
    std::operator>>((istream *)local_420,local_440);
    bVar2 = std::operator==(in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
    if (bVar2) {
      vec3f::vec3f(&local_44c);
      operator>>((istream *)in_stack_fffffffffffff8b0,(vec3f *)in_stack_fffffffffffff8a8);
      std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                ((vector<vec3f,_std::allocator<vec3f>_> *)in_stack_fffffffffffff8c0,
                 (value_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    }
    bVar2 = std::operator==(in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
    if (bVar2) {
      vec2f::vec2f(&local_454);
      operator>>((istream *)in_stack_fffffffffffff8b0,(vec2f *)in_stack_fffffffffffff8a8);
      std::vector<vec2f,_std::allocator<vec2f>_>::push_back
                ((vector<vec2f,_std::allocator<vec2f>_> *)in_stack_fffffffffffff8c0,
                 (value_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    }
    bVar2 = std::operator==(in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
    if (bVar2) {
      vec3f::vec3f((vec3f *)&stack0xfffffffffffffba0);
      operator>>((istream *)in_stack_fffffffffffff8b0,(vec3f *)in_stack_fffffffffffff8a8);
      std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                ((vector<vec3f,_std::allocator<vec3f>_> *)in_stack_fffffffffffff8c0,
                 (value_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    }
    bVar2 = std::operator==(in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
    if (bVar2) {
      std::vector<vec3f,_std::allocator<vec3f>_>::vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)0x187f24);
      std::vector<vec3f,_std::allocator<vec3f>_>::vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)0x187f31);
      std::vector<vec2f,_std::allocator<vec2f>_>::vector
                ((vector<vec2f,_std::allocator<vec2f>_> *)0x187f3e);
      local_4a9 = false;
      while( true ) {
        bVar1 = std::ios::fail();
        local_646 = 0;
        if ((bVar1 & 1) == 0) {
          local_646 = std::ios::eof();
          local_646 = local_646 ^ 0xff;
        }
        if ((local_646 & 1) == 0) break;
        memset(&local_4b8,0,0xc);
        for (local_4bc = 0; local_4bc < 3; local_4bc = local_4bc + 1) {
          iVar3 = std::istream::peek();
          if (iVar3 != 0x2f) {
            std::istream::operator>>(local_420,(int *)(&local_4b8 + local_4bc));
          }
          iVar3 = std::istream::peek();
          if (iVar3 != 0x2f) break;
          std::istream::get();
        }
        while( true ) {
          iVar3 = std::istream::peek();
          iVar3 = isspace(iVar3);
          if (iVar3 == 0) break;
          std::istream::get();
        }
        if (local_4b8 == 0.0) {
          github111116::ConsoleLogger::log<char[10],std::__cxx11::string>
                    (in_stack_fffffffffffff8c0,
                     (char (*) [10])CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                     in_stack_fffffffffffff8b0);
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = "error parsing obj";
          __cxa_throw(puVar6,&char_const*::typeinfo,0);
        }
        in_stack_fffffffffffffb38 = local_4b0;
        in_stack_fffffffffffffb3c = local_4b4;
        in_stack_fffffffffffffb40 = local_4b8;
        if ((int)local_4b8 < 0) {
          sVar9 = std::vector<vec3f,_std::allocator<vec3f>_>::size(&local_248);
          in_stack_fffffffffffffb40 = (float)((int)in_stack_fffffffffffffb40 + (int)sVar9 + 1);
        }
        if (in_stack_fffffffffffffb3c < 0) {
          sVar9 = std::vector<vec2f,_std::allocator<vec2f>_>::size(&local_278);
          in_stack_fffffffffffffb3c = in_stack_fffffffffffffb3c + (int)sVar9 + 1;
        }
        if (in_stack_fffffffffffffb38 < 0) {
          sVar9 = std::vector<vec3f,_std::allocator<vec3f>_>::size(&local_260);
          in_stack_fffffffffffffb38 = in_stack_fffffffffffffb38 + (int)sVar9 + 1;
        }
        std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                  (&local_248,(long)((int)in_stack_fffffffffffffb40 + -1));
        std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                  ((vector<vec3f,_std::allocator<vec3f>_> *)in_stack_fffffffffffff8c0,
                   (value_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
        if (in_stack_fffffffffffffb3c == 0) {
          vec2f::vec2f(&local_4d0);
        }
        else {
          pvVar10 = std::vector<vec2f,_std::allocator<vec2f>_>::operator[]
                              (&local_278,(long)(in_stack_fffffffffffffb3c + -1));
          local_4d0 = *pvVar10;
        }
        std::vector<vec2f,_std::allocator<vec2f>_>::push_back
                  ((vector<vec2f,_std::allocator<vec2f>_> *)in_stack_fffffffffffff8b0,
                   (value_type *)in_stack_fffffffffffff8a8);
        if (in_stack_fffffffffffffb38 == 0) {
          vec3f::vec3f(&local_4dc,0.0,1.0,0.0);
        }
        else {
          pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                              (&local_260,(long)(in_stack_fffffffffffffb38 + -1));
          local_4dc.x = pvVar11->x;
          local_4dc.y = pvVar11->y;
          local_4dc.z = pvVar11->z;
        }
        std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                  ((vector<vec3f,_std::allocator<vec3f>_> *)in_stack_fffffffffffff8b0,
                   (value_type *)in_stack_fffffffffffff8a8);
        local_4a9 = (local_4a9 & 1U) != 0 || in_stack_fffffffffffffb38 == 0;
      }
      sVar9 = std::vector<vec3f,_std::allocator<vec3f>_>::size
                        ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb88);
      if (sVar9 != 3) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "mesh face other than triangle not supported";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
      std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb88,1);
      std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb88,0);
      vVar14 = ::operator-((vec3f *)in_stack_fffffffffffff8c0,
                           (vec3f *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
      fVar13 = vVar14.z;
      vt2 = vVar14._0_8_;
      std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb88,2);
      std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb88,0);
      vVar14 = ::operator-((vec3f *)in_stack_fffffffffffff8c0,
                           (vec3f *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
      local_520 = vVar14.z;
      local_528 = vVar14._0_8_;
      local_518 = local_528;
      fVar15 = local_520;
      vVar14 = cross((vec3f *)in_stack_fffffffffffff8c0,
                     (vec3f *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
      local_538.z = vVar14.z;
      local_538._0_8_ = vVar14._0_8_;
      uVar16 = local_538._0_8_;
      fVar17 = local_538.z;
      vec3f::vec3f(&local_544,0.0);
      bVar2 = ::operator!=((vec3f *)&stack0xfffffffffffffb18,&local_544);
      if (bVar2) {
        operator_new(0xa0);
        std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                  ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb88,0);
        std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                  ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb88,1);
        std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                  ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb88,2);
        std::vector<vec2f,_std::allocator<vec2f>_>::operator[]
                  ((vector<vec2f,_std::allocator<vec2f>_> *)&stack0xfffffffffffffb58,0);
        std::vector<vec2f,_std::allocator<vec2f>_>::operator[]
                  ((vector<vec2f,_std::allocator<vec2f>_> *)&stack0xfffffffffffffb58,1);
        pvVar10 = std::vector<vec2f,_std::allocator<vec2f>_>::operator[]
                            ((vector<vec2f,_std::allocator<vec2f>_> *)&stack0xfffffffffffffb58,2);
        in_stack_fffffffffffff8a8 = *pvVar10;
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb70,0);
        in_stack_fffffffffffff8b8 = pvVar11->z;
        in_stack_fffffffffffff8b0 =
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pvVar11;
        pvVar11 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                            ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb70,1);
        in_stack_fffffffffffff8c0 = *(ConsoleLogger **)pvVar11;
        std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                  ((vector<vec3f,_std::allocator<vec3f>_> *)&stack0xfffffffffffffb70,2);
        v2.y = (float)in_stack_fffffffffffffb3c;
        v2.x = (float)in_stack_fffffffffffffb38;
        v2.z = in_stack_fffffffffffffb40;
        vVar14.z = fVar17;
        vVar14.x = (float)uVar16;
        vVar14.y = SUB84(uVar16,4);
        vt1.y = in_stack_fffffffffffffb04;
        vt1.x = fVar13;
        Triangle::Triangle((Triangle *)CONCAT44(in_stack_fffffffffffffaf4,fVar15),
                           in_stack_fffffffffffffb58,v2,vVar14,vt1,vt2,in_stack_fffffffffffffb70,
                           in_stack_fffffffffffffb78,in_stack_fffffffffffffb88,
                           in_stack_fffffffffffffb98);
        std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::push_back
                  ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
                   in_stack_fffffffffffff8b0,(value_type *)in_stack_fffffffffffff8a8);
        if ((local_4a9 & 1U) != 0) {
          ppBVar12 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::back
                               ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
                                in_stack_fffffffffffff8b0);
          if (*ppBVar12 == (value_type)0x0) {
            local_718 = (Triangle *)0x0;
          }
          else {
            local_718 = (Triangle *)
                        __dynamic_cast(*ppBVar12,&BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
          }
          Triangle::recompute_normal(local_718);
        }
      }
      std::vector<vec2f,_std::allocator<vec2f>_>::~vector
                ((vector<vec2f,_std::allocator<vec2f>_> *)in_stack_fffffffffffff8c0);
      std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)in_stack_fffffffffffff8c0);
      std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)in_stack_fffffffffffff8c0);
    }
    std::__cxx11::string::~string(local_440);
    std::__cxx11::stringstream::~stringstream(local_420);
  } while( true );
}

Assistant:

std::vector<BasicPrimitive*> loadfromfile(const char* filename)
	{
		console.log("Loading mesh:", filename);
		if (strcmp(filename+strlen(filename)-4, ".obj") != 0)
			throw "format must be obj";
		std::ifstream fin(filename);
		if (!fin)
			throw "Can't open file";
		std::vector<BasicPrimitive*> faces;
		std::vector<vec3f> v,vn;
		std::vector<vec2f> vt;
		std::string line;
		// reading file line by line
		while (std::getline(fin, line)) {
			if (isalpha(line[0])) {
				std::stringstream in(line);
				std::string cmd;
				in >> cmd;
				if (cmd == "v") { // vertex coordinate
					vec3f t;
					in >> t;
					v.push_back(t);
				}
				if (cmd == "vt") { // texture coordinate
					vec2f t;
					in >> t;
					vt.push_back(t);
				}
				if (cmd == "vn") { // normal vector
					vec3f t;
					in >> t;
					vn.push_back(t);
				}
				if (cmd == "f") { // polygon face
					std::vector<vec3f> vv, vvn;
					std::vector<vec2f> vvt;
					bool recompute_normal = false;
					while (!in.fail() && !in.eof()) {					
						// code from tungsten ObjLoader::loadFace
						int indices[] = {0, 0, 0};
						for (int i = 0; i < 3; ++i) {
							if (in.peek() != '/')
								in >> indices[i];
							if (in.peek() == '/')
								in.get();
							else
								break;
						}
						while (isspace(in.peek()))
							in.get();
						if (!indices[0]) {
							console.log("Obj line:", line);
							throw "error parsing obj";
						}
						int iv = indices[0];
						int ivt = indices[1];
						int ivn = indices[2];
						if (iv < 0) iv += v.size()+1;
						if (ivt < 0) ivt += vt.size()+1;
						if (ivn < 0) ivn += vn.size()+1;
						vv.push_back(v[iv-1]);
						vvt.push_back(ivt? vt[ivt-1]: vec2f());
						vvn.push_back(ivn? vn[ivn-1]: vec3f(0,1,0));
						recompute_normal |= !ivn;
					}
					if (vv.size() == 3) {
						// ignore triangles of zero surface area
						if (cross(vv[1]-vv[0],vv[2]-vv[0]) != vec3f(0)) {
							faces.push_back(new Triangle(vv[0], vv[1], vv[2], vvt[0], vvt[1], vvt[2], vvn[0], vvn[1], vvn[2]));
							if (recompute_normal)
								dynamic_cast<Triangle*>(faces.back())->recompute_normal();
						}
					}
					else {
						throw "mesh face other than triangle not supported";
					}
				} // end reading face
			}
		}
		return faces;
	}